

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O3

void aGLFramebufferDestroy(AGLFramebuffer fbo)

{
  undefined8 in_RDI;
  undefined8 local_10;
  
  if ((GLuint)in_RDI == 0) {
    local_10._4_4_ = (int)((ulong)in_RDI >> 0x20);
  }
  else {
    local_10 = in_RDI;
    if (a__gl_state.framebuffer.binding == (GLuint)in_RDI) {
      a__gl_state.framebuffer.binding = 0;
      glBindFramebuffer(0x8d40,0);
    }
    glDeleteFramebuffers(1,&local_10);
  }
  if (local_10._4_4_ != 0) {
    glDeleteRenderbuffers(1,(long)&local_10 + 4);
  }
  return;
}

Assistant:

void aGLFramebufferDestroy(AGLFramebuffer fbo) {
	if (fbo.name) {
		if (fbo.name == a__gl_state.framebuffer.binding)
			AGL__CALL(glBindFramebuffer(GL_FRAMEBUFFER, a__gl_state.framebuffer.binding = 0));
		glDeleteFramebuffers(1, &fbo.name);
	}

	if (fbo.depth_renderbuffer)
		glDeleteRenderbuffers(1, &fbo.depth_renderbuffer);
}